

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O2

Abc_Ntk_t * Io_ReadPla(char *pFileName,int fZeros,int fBoth,int fCheck)

{
  char cVar1;
  Vec_Str_t *p;
  FILE *pFile;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint n;
  Extra_FileReader_t *p_00;
  char *pcVar6;
  Abc_Ntk_t *pNtk;
  ProgressBar *p_01;
  void *pvVar7;
  void *__ptr;
  Abc_Obj_t *pAVar8;
  undefined8 *puVar9;
  void *pvVar10;
  Abc_Obj_t *pFanin;
  size_t sVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  Mem_Flex_t *pMan;
  ulong uVar16;
  uint local_e0;
  uint local_ac;
  uint local_a8;
  char local_98 [104];
  
  p_00 = Extra_FileReaderAlloc(pFileName,"#","\n\r"," \t|");
  if (p_00 == (Extra_FileReader_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  pcVar6 = Extra_FileReaderGetFileName(p_00);
  pNtk = Abc_NtkStartRead(pcVar6);
  pFile = _stdout;
  iVar2 = Extra_FileReaderGetFileSize(p_00);
  p_01 = Extra_ProgressBarStart(pFile,iVar2);
  n = 0xffffffff;
  local_e0 = 0xffffffff;
  __ptr = (void *)0x0;
  local_a8 = 0;
  local_ac = local_e0;
LAB_0029ab98:
  do {
    do {
      pvVar7 = Extra_FileReaderGetTokens(p_00);
      if (pvVar7 == (void *)0x0) {
LAB_0029b032:
        Extra_ProgressBarStop(p_01);
        if (local_a8 != local_ac && local_ac != 0xffffffff) {
          printf(
                "Warning: Mismatch between the number of cubes (%d) and the number on .p line (%d).\n"
                );
        }
        for (lVar14 = 0; lVar14 < pNtk->vPos->nSize; lVar14 = lVar14 + 1) {
          pAVar8 = Abc_NtkPo(pNtk,(int)lVar14);
          pAVar8 = Abc_ObjFanin0Ntk((Abc_Obj_t *)
                                    pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray]);
          p = *(Vec_Str_t **)((long)__ptr + lVar14 * 8);
          if (p->nSize == 0) {
            Abc_ObjRemoveFanins(pAVar8);
            pMan = (Mem_Flex_t *)pNtk->pManFunc;
            pcVar6 = " 0\n";
          }
          else {
            Vec_StrPush(p,'\0');
            Io_ReadPlaCubePreprocess(*(Vec_Str_t **)((long)__ptr + lVar14 * 8),(int)lVar14,0);
            pMan = (Mem_Flex_t *)pNtk->pManFunc;
            pcVar6 = *(char **)(*(long *)((long)__ptr + lVar14 * 8) + 8);
          }
          pcVar6 = Abc_SopRegister(pMan,pcVar6);
          (pAVar8->field_5).pData = pcVar6;
          pvVar7 = *(void **)((long)__ptr + lVar14 * 8);
          free(*(void **)((long)pvVar7 + 8));
          free(pvVar7);
        }
        free(__ptr);
        Abc_NtkFinalizeRead(pNtk);
LAB_0029b11f:
        Extra_FileReaderFree(p_00);
        if (pNtk == (Abc_Ntk_t *)0x0) {
          return (Abc_Ntk_t *)0x0;
        }
        if (fCheck != 0) {
          iVar2 = Abc_NtkCheckRead(pNtk);
          if (iVar2 == 0) {
            puts("Io_ReadPla: The network check has failed.");
            Abc_NtkDelete(pNtk);
            return (Abc_Ntk_t *)0x0;
          }
          return pNtk;
        }
        return pNtk;
      }
      iVar2 = Extra_FileReaderGetCurPosition(p_00);
      if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= iVar2)) {
        Extra_ProgressBarUpdate_int(p_01,iVar2,(char *)0x0);
      }
      uVar3 = Extra_FileReaderGetLineNumber(p_00,0);
      puVar9 = *(undefined8 **)((long)pvVar7 + 8);
      pcVar6 = (char *)*puVar9;
      cVar1 = *pcVar6;
      if ((cVar1 == '.') && (pcVar6[1] == 'e')) goto LAB_0029b032;
      iVar2 = strncmp(pcVar6,".type",5);
    } while (iVar2 == 0);
    iVar2 = strcmp(pcVar6,".model");
    if (iVar2 != 0) {
      iVar2 = *(int *)((long)pvVar7 + 4);
      if (iVar2 == 1) {
        pcVar6 = Extra_FileReaderGetFileName(p_00);
        pcVar12 = "%s (line %d): Wrong number of token.\n";
LAB_0029b17f:
        printf(pcVar12,pcVar6,(ulong)uVar3);
        goto LAB_0029b18d;
      }
      if (cVar1 == '.') {
        cVar1 = pcVar6[1];
        if (cVar1 == 'p') {
          if (pcVar6[2] == '\0') {
            local_ac = atoi((char *)puVar9[1]);
            goto LAB_0029ab98;
          }
        }
        else if (cVar1 == 'o') {
          if (pcVar6[2] == '\0') {
            n = atoi((char *)puVar9[1]);
            goto LAB_0029ab98;
          }
        }
        else if ((cVar1 == 'i') && (pcVar6[2] == '\0')) {
          local_e0 = atoi((char *)puVar9[1]);
          goto LAB_0029ab98;
        }
      }
      iVar4 = strcmp(pcVar6,".ilb");
      if (iVar4 == 0) {
        if (iVar2 - 1U != local_e0) {
          printf(
                "Warning: Mismatch between the number of PIs on the .i line (%d) and the number of PIs on the .ilb line (%d).\n"
                );
        }
        for (lVar14 = 1; lVar14 < *(int *)((long)pvVar7 + 4); lVar14 = lVar14 + 1) {
          Io_ReadCreatePi(pNtk,*(char **)(*(long *)((long)pvVar7 + 8) + lVar14 * 8));
        }
      }
      else {
        iVar4 = strcmp(pcVar6,".ob");
        if (iVar4 != 0) {
          if (pNtk->vPis->nSize == 0) {
            if (local_e0 != 0xffffffff) {
              iVar2 = Abc_Base10Log(local_e0);
              uVar15 = 0;
              uVar5 = 0;
              if (0 < (int)local_e0) {
                uVar5 = local_e0;
              }
              for (; uVar5 != (uint)uVar15; uVar15 = (ulong)((uint)uVar15 + 1)) {
                sprintf(local_98,"x%0*d",iVar2,uVar15);
                Io_ReadCreatePi(pNtk,local_98);
              }
              goto LAB_0029ad61;
            }
            pcVar6 = Extra_FileReaderGetFileName(p_00);
            pcVar12 = "%s: The number of inputs is not specified.\n";
LAB_0029b257:
            printf(pcVar12,pcVar6);
LAB_0029b18d:
            Abc_NtkDelete(pNtk);
            Extra_ProgressBarStop(p_01);
            free(__ptr);
          }
          else {
LAB_0029ad61:
            if (pNtk->vPos->nSize == 0) {
              if (n == 0xffffffff) {
                pcVar6 = Extra_FileReaderGetFileName(p_00);
                pcVar12 = "%s: The number of outputs is not specified.\n";
                goto LAB_0029b257;
              }
              iVar2 = Abc_Base10Log(n);
              uVar13 = 0;
              uVar5 = 0;
              if (0 < (int)n) {
                uVar5 = n;
              }
              for (; uVar5 != uVar13; uVar13 = uVar13 + 1) {
                sprintf(local_98,"z%0*d",iVar2,(ulong)uVar13);
                Io_ReadCreatePo(pNtk,local_98);
              }
            }
            if (pNtk->nObjCounts[7] == 0) {
              __ptr = malloc((long)(int)n << 3);
              for (lVar14 = 0; lVar14 < pNtk->vPos->nSize; lVar14 = lVar14 + 1) {
                pAVar8 = Abc_NtkPo(pNtk,(int)lVar14);
                puVar9 = (undefined8 *)malloc(0x10);
                *puVar9 = 100;
                pvVar10 = malloc(100);
                puVar9[1] = pvVar10;
                *(undefined8 **)((long)__ptr + lVar14 * 8) = puVar9;
                pFanin = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
                pAVar8 = Abc_ObjFanin0Ntk(pAVar8);
                Abc_ObjAddFanin(pAVar8,pFanin);
                for (iVar2 = 0; iVar2 < pNtk->vPis->nSize; iVar2 = iVar2 + 1) {
                  pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis,iVar2);
                  if (pAVar8->pNtk->ntkType == ABC_NTK_NETLIST) {
                    pAVar8 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray];
                  }
                  Abc_ObjAddFanin(pFanin,pAVar8);
                }
              }
            }
            if (*(int *)((long)pvVar7 + 4) != 2) {
              pcVar6 = Extra_FileReaderGetFileName(p_00);
              pcVar12 = "%s (line %d): Input and output cubes are not specified.\n";
              goto LAB_0029b17f;
            }
            pcVar6 = (char *)**(undefined8 **)((long)pvVar7 + 8);
            pcVar12 = (char *)(*(undefined8 **)((long)pvVar7 + 8))[1];
            sVar11 = strlen(pcVar6);
            if (local_e0 == (uint)sVar11) {
              sVar11 = strlen(pcVar12);
              if (n != (uint)sVar11) {
                pcVar6 = Extra_FileReaderGetFileName(p_00);
                sVar11 = strlen(pcVar12);
                printf("%s (line %d): Output cube length (%d) differs from the number of outputs (%d).\n"
                       ,pcVar6,(ulong)uVar3,sVar11 & 0xffffffff,(ulong)n);
                goto LAB_0029b18d;
              }
              uVar15 = 0;
              if (0 < (int)n) {
                uVar15 = (ulong)n;
              }
              if (fBoth == 0) {
                if (fZeros == 0) {
                  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
                    if (pcVar12[uVar16] == '1') {
                      Vec_StrPrintStr(*(Vec_Str_t **)((long)__ptr + uVar16 * 8),pcVar6);
                      Vec_StrPrintStr(*(Vec_Str_t **)((long)__ptr + uVar16 * 8)," 1\n");
                    }
                  }
                }
                else {
                  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
                    if (pcVar12[uVar16] == '0') {
                      Vec_StrPrintStr(*(Vec_Str_t **)((long)__ptr + uVar16 * 8),pcVar6);
                      Vec_StrPrintStr(*(Vec_Str_t **)((long)__ptr + uVar16 * 8)," 1\n");
                    }
                  }
                }
              }
              else {
                for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
                  if ((pcVar12[uVar16] & 0xfeU) == 0x30) {
                    Vec_StrPrintStr(*(Vec_Str_t **)((long)__ptr + uVar16 * 8),pcVar6);
                    Vec_StrPrintStr(*(Vec_Str_t **)((long)__ptr + uVar16 * 8)," 1\n");
                  }
                }
              }
              local_a8 = local_a8 + 1;
              goto LAB_0029ab98;
            }
            pcVar12 = Extra_FileReaderGetFileName(p_00);
            sVar11 = strlen(pcVar6);
            printf("%s (line %d): Input cube length (%d) differs from the number of inputs (%d).\n",
                   pcVar12,(ulong)uVar3,sVar11 & 0xffffffff,(ulong)local_e0);
            Abc_NtkDelete(pNtk);
          }
          pNtk = (Abc_Ntk_t *)0x0;
          goto LAB_0029b11f;
        }
        if (iVar2 - 1U != n) {
          printf(
                "Warning: Mismatch between the number of POs on the .o line (%d) and the number of POs on the .ob line (%d).\n"
                );
        }
        for (lVar14 = 1; lVar14 < *(int *)((long)pvVar7 + 4); lVar14 = lVar14 + 1) {
          Io_ReadCreatePo(pNtk,*(char **)(*(long *)((long)pvVar7 + 8) + lVar14 * 8));
        }
      }
      goto LAB_0029ab98;
    }
    if (pNtk->pName != (char *)0x0) {
      free(pNtk->pName);
      pNtk->pName = (char *)0x0;
      puVar9 = *(undefined8 **)((long)pvVar7 + 8);
    }
    pcVar6 = Extra_UtilStrsav((char *)puVar9[1]);
    pNtk->pName = pcVar6;
  } while( true );
}

Assistant:

Abc_Ntk_t * Io_ReadPla( char * pFileName, int fZeros, int fBoth, int fCheck )
{
    Extra_FileReader_t * p;
    Abc_Ntk_t * pNtk;

    // start the file
    p = Extra_FileReaderAlloc( pFileName, "#", "\n\r", " \t|" );
//    p = Extra_FileReaderAlloc( pFileName, "", "\n\r", " \t|" );
    if ( p == NULL )
        return NULL;

    // read the network
    pNtk = Io_ReadPlaNetwork( p, fZeros, fBoth );
    Extra_FileReaderFree( p );
    if ( pNtk == NULL )
        return NULL;

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pNtk ) )
    {
        printf( "Io_ReadPla: The network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}